

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzgeoblend.h
# Opt level: O3

void __thiscall
pzgeom::TPZGeoBlend<pzgeom::TPZGeoQuad>::TPZGeoBlend(TPZGeoBlend<pzgeom::TPZGeoQuad> *this)

{
  long lVar1;
  
  *(undefined4 *)
   ((this->super_TPZGeoQuad).super_TPZNodeRep<4,_pztopology::TPZQuadrilateral>.fNodeIndexes + 2) =
       0xffffffff;
  *(undefined4 *)
   ((long)(this->super_TPZGeoQuad).super_TPZNodeRep<4,_pztopology::TPZQuadrilateral>.fNodeIndexes +
   0x14) = 0xffffffff;
  *(undefined4 *)
   ((this->super_TPZGeoQuad).super_TPZNodeRep<4,_pztopology::TPZQuadrilateral>.fNodeIndexes + 3) =
       0xffffffff;
  *(undefined4 *)
   ((long)(this->super_TPZGeoQuad).super_TPZNodeRep<4,_pztopology::TPZQuadrilateral>.fNodeIndexes +
   0x1c) = 0xffffffff;
  *(undefined4 *)
   (this->super_TPZGeoQuad).super_TPZNodeRep<4,_pztopology::TPZQuadrilateral>.fNodeIndexes =
       0xffffffff;
  *(undefined4 *)
   ((long)(this->super_TPZGeoQuad).super_TPZNodeRep<4,_pztopology::TPZQuadrilateral>.fNodeIndexes +
   4) = 0xffffffff;
  *(undefined4 *)
   ((this->super_TPZGeoQuad).super_TPZNodeRep<4,_pztopology::TPZQuadrilateral>.fNodeIndexes + 1) =
       0xffffffff;
  *(undefined4 *)
   ((long)(this->super_TPZGeoQuad).super_TPZNodeRep<4,_pztopology::TPZQuadrilateral>.fNodeIndexes +
   0xc) = 0xffffffff;
  (this->super_TPZGeoQuad).super_TPZNodeRep<4,_pztopology::TPZQuadrilateral>.super_TPZQuadrilateral.
  super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZGeoBlend_0188ec78;
  lVar1 = 0x40;
  do {
    *(undefined ***)
     ((long)(this->super_TPZGeoQuad).super_TPZNodeRep<4,_pztopology::TPZQuadrilateral>.fNodeIndexes
     + lVar1 + -0x18) = &PTR__TPZGeoElSideIndex_0187bb90;
    *(undefined4 *)
     ((long)(this->super_TPZGeoQuad).super_TPZNodeRep<4,_pztopology::TPZQuadrilateral>.fNodeIndexes
     + lVar1 + -8) = 0xffffffff;
    *(undefined8 *)
     ((long)(this->super_TPZGeoQuad).super_TPZNodeRep<4,_pztopology::TPZQuadrilateral>.fNodeIndexes
     + lVar1 + -0x10) = 0xffffffffffffffff;
    lVar1 = lVar1 + 0x18;
  } while (lVar1 != 0xd0);
  lVar1 = 0;
  do {
    TPZTransform<double>::TPZTransform((TPZTransform<double> *)(&this->field_0xc0 + lVar1));
    lVar1 = lVar1 + 0x1a0;
  } while (lVar1 != 0x9c0);
  return;
}

Assistant:

TPZGeoBlend() : TPZRegisterClassId(&TPZGeoBlend::ClassId),
                        TGeo() {
        }